

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

void __thiscall GGSock::Communicator::Data::doSend(Data *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ssize_t sVar5;
  size_type sVar6;
  long in_RDI;
  TErrorCode errorCode;
  int rc;
  int offset;
  TBufferSize size;
  value_type *curMessage;
  undefined6 in_stack_ffffffffffffffc8;
  short in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_18;
  uint local_14;
  
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
  ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
                *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
  local_14 = std::__cxx11::string::size();
  local_18 = 0;
  do {
    while( true ) {
      if (local_14 == 0) goto LAB_00131caa;
      iVar3 = *(int *)(in_RDI + 0x14);
      lVar4 = std::__cxx11::string::data();
      sVar5 = ::send(iVar3,(void *)(lVar4 + local_18),(ulong)local_14,0);
      iVar2 = (int)sVar5;
      if (iVar2 < 0) break;
      local_14 = local_14 - iVar2;
      local_18 = iVar2 + local_18;
    }
    bVar1 = anon_unknown.dwarf_7001::e_wouldBlock();
  } while (bVar1);
  *(undefined1 *)(in_RDI + 2) = 0;
  anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x131c3d);
  anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x131c4b);
  bVar1 = std::function::operator_cast_to_bool((function<void_(short)> *)0x131c5c);
  if (bVar1) {
    __errno_location();
    std::function<void_(short)>::operator()
              ((function<void_(short)> *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffce);
  }
LAB_00131caa:
  iVar3 = *(int *)(in_RDI + 0x15c) + 1;
  *(int *)(in_RDI + 0x15c) = iVar3;
  sVar6 = std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
          ::size((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
                  *)(in_RDI + 0x168));
  if ((int)sVar6 <= iVar3) {
    *(undefined4 *)(in_RDI + 0x15c) = 0;
  }
  return;
}

Assistant:

void doSend() {
            const auto & curMessage = ringBufferSend[rbHead];
            TBufferSize size = (TBufferSize) curMessage.size();

            int offset = 0;
            while (size > 0) {
                int rc = (int) ::send(sdpeer, curMessage.data() + offset, size, 0);
                if (rc < 0) {
                    if (e_wouldBlock() == false) {
                        isConnected = false;
                        ::closeAndReset(sdpeer);
                        ::closeAndReset(sd);

                        if (errorCallback) {
                            TErrorCode errorCode = errno;
                            errorCallback(errorCode);
                        }

                        break;
                    }
                    continue;
                }
                size -= rc;
                offset += rc;
            }

            if (++rbHead >= (int) ringBufferSend.size()) {
                rbHead = 0;
            }
        }